

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O0

int Dch_NodesAreEqual(void *p,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  uint *puVar4;
  uint *puVar5;
  int local_44;
  int nWords;
  int k;
  uint *pSim1;
  uint *pSim0;
  Vec_Ptr_t *vSims;
  Aig_Obj_t *pObj1_local;
  Aig_Obj_t *pObj0_local;
  void *p_local;
  
  pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)p,1);
  pvVar3 = Vec_PtrEntry((Vec_Ptr_t *)p,0);
  iVar1 = (int)((long)pvVar2 - (long)pvVar3 >> 2);
  puVar4 = Dch_ObjSim((Vec_Ptr_t *)p,pObj0);
  puVar5 = Dch_ObjSim((Vec_Ptr_t *)p,pObj1);
  if (((uint)(*(ulong *)&pObj0->field_0x18 >> 3) & 1) ==
      ((uint)(*(ulong *)&pObj1->field_0x18 >> 3) & 1)) {
    for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
      if (puVar4[local_44] != puVar5[local_44]) {
        return 0;
      }
    }
  }
  else {
    for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
      if (puVar4[local_44] != (puVar5[local_44] ^ 0xffffffff)) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int Dch_NodesAreEqual( void * p, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Vec_Ptr_t * vSims = (Vec_Ptr_t *)p;
    unsigned * pSim0, * pSim1;
    int k, nWords;
    nWords = (unsigned *)Vec_PtrEntry(vSims, 1) - (unsigned *)Vec_PtrEntry(vSims, 0);
    pSim0 = Dch_ObjSim( vSims, pObj0 );
    pSim1 = Dch_ObjSim( vSims, pObj1 );
    if ( pObj0->fPhase != pObj1->fPhase )
    {
        for ( k = 0; k < nWords; k++ )
            if ( pSim0[k] != ~pSim1[k] )
                return 0;
    }
    else
    {
        for ( k = 0; k < nWords; k++ )
            if ( pSim0[k] != pSim1[k] )
                return 0;
    }
    return 1;
}